

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitBinary(InternalAnalyzer *this,Binary *curr)

{
  bool bVar1;
  Const *pCVar2;
  long lVar3;
  Const *c;
  Binary *curr_local;
  InternalAnalyzer *this_local;
  
  if ((curr->op - DivSInt32 < 4) || (curr->op - DivSInt64 < 4)) {
    pCVar2 = Expression::dynCast<wasm::Const>(curr->right);
    if (pCVar2 == (Const *)0x0) {
      this->parent->implicitTrap = true;
    }
    else {
      bVar1 = Literal::isZero(&pCVar2->value);
      if (bVar1) {
        this->parent->implicitTrap = true;
      }
      else if (((curr->op == DivSInt32) || (curr->op == DivSInt64)) &&
              (lVar3 = ::wasm::Literal::getInteger(), lVar3 == -1)) {
        this->parent->implicitTrap = true;
      }
    }
  }
  return;
}

Assistant:

void visitBinary(Binary* curr) {
      switch (curr->op) {
        case DivSInt32:
        case DivUInt32:
        case RemSInt32:
        case RemUInt32:
        case DivSInt64:
        case DivUInt64:
        case RemSInt64:
        case RemUInt64: {
          // div and rem may contain implicit trap only if RHS is
          // non-constant or constant which equal zero or -1 for
          // signed divisions. Reminder traps only with zero
          // divider.
          if (auto* c = curr->right->dynCast<Const>()) {
            if (c->value.isZero()) {
              parent.implicitTrap = true;
            } else if ((curr->op == DivSInt32 || curr->op == DivSInt64) &&
                       c->value.getInteger() == -1LL) {
              parent.implicitTrap = true;
            }
          } else {
            parent.implicitTrap = true;
          }
          break;
        }
        default: {
        }
      }
    }